

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cpp
# Opt level: O3

void __thiscall MeterPrivate::drawScale(MeterPrivate *this,QPainter *painter,DrawParams *params)

{
  double *pdVar1;
  double dVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  ulong uVar9;
  double dVar10;
  QVector<qreal> alreadyDrawn;
  double local_b0;
  double local_a8;
  double local_a0;
  undefined1 local_98 [24];
  ulong uStack_80;
  ulong local_70;
  MeterPrivate *local_68;
  undefined8 uStack_60;
  QColor *local_50;
  double local_48;
  undefined8 uStack_40;
  
  QPainter::save();
  QPainter::setPen((QColor *)painter);
  dVar10 = params->margin;
  local_98._0_8_ = dVar10 + (params->rect).xp;
  local_98._8_8_ = (params->rect).yp + dVar10;
  dVar2 = ((params->rect).h - dVar10) - dVar10;
  unique0x10000376 = SUB84(dVar2,0);
  local_98._16_8_ = ((params->rect).w - dVar10) - dVar10;
  unique0x1000037a = (int)((ulong)dVar2 >> 0x20);
  QPainter::drawArc((QRectF *)painter,(int)local_98,(int)((-90.0 - params->startScaleAngle) * 16.0))
  ;
  local_98._0_8_ = (undefined8)this->radius;
  local_98._8_8_ = local_98._0_8_;
  QPainter::translate((QPointF *)painter);
  QPainter::rotate(params->startScaleAngle);
  local_98._0_8_ = (QArrayData *)0x0;
  local_98._8_8_ = (double *)0x0;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uStack_80;
  stack0xffffffffffffff78 = auVar3 << 0x40;
  local_b0 = params->startScaleAngle;
  QtPrivate::QPodArrayOps<double>::emplace<double&>((QPodArrayOps<double> *)local_98,0,&local_b0);
  dVar10 = this->scaleGridStep;
  if (dVar10 <= 0.0) {
    local_b0 = (double)((ulong)(uint)(int)((double)this->radius - params->margin) << 0x20);
    local_a8 = (double)((ulong)(uint)(int)(((double)this->radius - params->gridLabelSize) -
                                          params->margin) << 0x20);
    QPainter::drawLines((QLine *)painter,(int)&local_b0);
    QPainter::rotate(params->scaleDegree);
    local_b0 = params->scaleDegree;
    QtPrivate::QPodArrayOps<double>::emplace<double&>
              ((QPodArrayOps<double> *)local_98,local_98._16_8_,&local_b0);
    local_b0 = (double)((ulong)(uint)(int)((double)this->radius - params->margin) << 0x20);
    local_a8 = (double)((ulong)(uint)(int)(((double)this->radius - params->gridLabelSize) -
                                          params->margin) << 0x20);
    QPainter::drawLines((QLine *)painter,(int)&local_b0);
  }
  else {
    dVar2 = this->maxValue - this->minValue;
    local_48 = dVar2 / dVar10;
    uStack_40 = 0;
    uVar4 = (uint)local_48;
    local_70 = (ulong)uVar4;
    local_a0 = dVar10;
    local_68 = this;
    local_50 = &this->textColor;
    if (-1 < (int)uVar4) {
      local_a0 = dVar10 * (params->scaleDegree / dVar2);
      iVar6 = 0;
      do {
        local_b0 = (double)((ulong)(uint)(int)((double)local_68->radius - params->margin) << 0x20);
        local_a8 = (double)((ulong)(uint)(int)(((double)local_68->radius - params->gridLabelSize) -
                                              params->margin) << 0x20);
        QPainter::drawLines((QLine *)painter,(int)&local_b0);
        QPainter::rotate(local_a0);
        local_b0 = (double)iVar6 * local_a0 + params->startScaleAngle;
        QtPrivate::QPodArrayOps<double>::emplace<double&>
                  ((QPodArrayOps<double> *)local_98,local_98._16_8_,&local_b0);
        iVar6 = iVar6 + 1;
      } while (uVar4 + 1 != iVar6);
    }
    this = local_68;
    dVar10 = local_48 - (double)(int)local_70;
    uVar9 = -(ulong)(dVar10 < -dVar10);
    if (1e-06 < (double)(~uVar9 & (ulong)dVar10 | (ulong)-dVar10 & uVar9)) {
      QPainter::restore();
      QPainter::save();
      local_b0 = (double)this->radius;
      local_a8 = local_b0;
      QPainter::translate((QPointF *)painter);
      QPainter::rotate(params->startScaleAngle + params->scaleDegree);
      QPainter::setPen((QColor *)painter);
      local_b0 = (double)((ulong)(uint)(int)((double)this->radius - params->margin) << 0x20);
      local_a8 = (double)((ulong)(uint)(int)(((double)this->radius - params->gridLabelSize) -
                                            params->margin) << 0x20);
      QPainter::drawLines((QLine *)painter,(int)&local_b0);
      local_b0 = params->startScaleAngle + params->scaleDegree;
      QtPrivate::QPodArrayOps<double>::emplace<double&>
                ((QPodArrayOps<double> *)local_98,local_98._16_8_,&local_b0);
    }
  }
  QPainter::restore();
  if (0.0 < this->scaleStep) {
    QPainter::save();
    QPainter::setPen((QColor *)painter);
    local_b0 = (double)this->radius;
    local_a8 = local_b0;
    QPainter::translate((QPointF *)painter);
    QPainter::rotate(params->startScaleAngle);
    local_68 = (MeterPrivate *)((this->maxValue - this->minValue) / this->scaleStep);
    uStack_60 = 0;
    local_a0 = params->scaleDegree / (double)(int)(double)local_68;
    QPainter::rotate(local_a0);
    iVar6 = (int)(double)local_68;
    if (1 < iVar6) {
      iVar7 = 0;
      do {
        if ((long)local_98._16_8_ < 1) {
LAB_00109331:
          local_b0 = (double)((ulong)(uint)(int)((double)this->radius - params->margin) << 0x20);
          local_a8 = (double)((ulong)(uint)(int)(((double)this->radius - params->scaleWidth) -
                                                params->margin) << 0x20);
          QPainter::drawLines((QLine *)painter,(int)&local_b0);
        }
        else {
          dVar10 = (double)iVar7 * local_a0 + params->startScaleAngle + local_a0;
          lVar5 = 0;
          do {
            if (local_98._16_8_ << 3 == lVar5) goto LAB_00109331;
            pdVar1 = (double *)(local_98._8_8_ + lVar5);
            lVar5 = lVar5 + 8;
          } while ((*pdVar1 != dVar10) || (NAN(*pdVar1) || NAN(dVar10)));
          if (lVar5 == 0) goto LAB_00109331;
        }
        QPainter::rotate(local_a0);
        bVar8 = iVar7 != iVar6 + -2;
        iVar7 = iVar7 + 1;
      } while (bVar8);
    }
    QPainter::restore();
  }
  if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_98._0_8_,8,8);
    }
  }
  return;
}

Assistant:

void
MeterPrivate::drawScale( QPainter & painter, DrawParams & params )
{
	painter.save();
	painter.setPen( textColor );
	painter.drawArc( params.rect -
	QMarginsF( params.margin, params.margin, params.margin, params.margin ),
		( -90.0 - params.startScaleAngle ) * 16, -params.scaleDegree * 16 );
	painter.translate( radius, radius );
	painter.rotate( params.startScaleAngle );

	QVector< qreal > alreadyDrawn;
	alreadyDrawn.append( params.startScaleAngle );

	if( scaleGridStep > 0.0 )
	{
		const int stepsCount = ( ( maxValue - minValue ) / scaleGridStep );
		const qreal fullStepsCount = ( ( maxValue - minValue ) / scaleGridStep );
		const qreal scaleStepInDegree = params.scaleDegree / ( maxValue - minValue ) * scaleGridStep;

		for( int i = 0; i <= stepsCount; ++i )
		{
			painter.drawLine( 0, radius - params.margin, 0,
				radius - params.gridLabelSize - params.margin );
			painter.rotate( scaleStepInDegree );
			alreadyDrawn.append( params.startScaleAngle + i * scaleStepInDegree );
		}

		if( qAbs( fullStepsCount - stepsCount ) > 0.000001 )
		{
			painter.restore();

			painter.save();

			painter.translate( radius, radius );
			painter.rotate( params.startScaleAngle + params.scaleDegree );
			painter.setPen( textColor );

			painter.drawLine( 0, radius - params.margin, 0,
				radius - params.gridLabelSize - params.margin );

			alreadyDrawn.append( params.startScaleAngle + params.scaleDegree );
		}
	}
	else
	{
		painter.drawLine( 0, radius - params.margin, 0,
			radius - params.gridLabelSize - params.margin );

		painter.rotate( params.scaleDegree );

		alreadyDrawn.append( params.scaleDegree );

		painter.drawLine( 0, radius - params.margin, 0,
			radius - params.gridLabelSize - params.margin );
	}

	painter.restore();

	if( scaleStep > 0.0 )
	{
		painter.save();
		painter.setPen( textColor );
		painter.translate( radius, radius );
		painter.rotate( params.startScaleAngle );

		int stepsCount = ( ( maxValue - minValue ) / scaleStep );
		const qreal scaleStepInDegree = params.scaleDegree / stepsCount;

		stepsCount -= 2;

		painter.rotate( scaleStepInDegree );

		for( int i = 0; i <= stepsCount; ++i )
		{
			if( !alreadyDrawn.contains( ( params.startScaleAngle + scaleStepInDegree )
				+ i * scaleStepInDegree ) )
					painter.drawLine( 0, radius - params.margin, 0,
						radius - params.scaleWidth - params.margin );

			painter.rotate( scaleStepInDegree );
		}

		painter.restore();
	}
}